

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O0

idx_t __thiscall
duckdb::ListColumnData::ScanCount
          (ListColumnData *this,ColumnScanState *state,Vector *result,idx_t count,
          idx_t result_offset)

{
  unsigned_long uVar1;
  PhysicalType PVar2;
  int iVar3;
  undefined8 uVar4;
  unsigned_long *puVar5;
  idx_t iVar6;
  list_entry_t *plVar7;
  long lVar8;
  Vector *this_00;
  LogicalType *pLVar9;
  reference pvVar10;
  ulong uVar11;
  pointer pCVar12;
  undefined4 extraout_var;
  long in_RCX;
  long in_RSI;
  Vector *in_RDI;
  long in_R8;
  Vector *child_entry;
  idx_t child_scan_count;
  idx_t offset_index;
  idx_t i;
  idx_t current_offset;
  idx_t base_offset;
  list_entry_t *result_data;
  unsigned_long last_entry;
  unsigned_long *data;
  UnifiedVectorFormat offsets;
  idx_t scan_count;
  Vector offset_vector;
  string *in_stack_fffffffffffffd78;
  reference in_stack_fffffffffffffd80;
  Vector *in_stack_fffffffffffffd88;
  ColumnScanState *in_stack_fffffffffffffd90;
  ColumnData *in_stack_fffffffffffffd98;
  allocator *paVar13;
  LogicalType *in_stack_fffffffffffffda0;
  idx_t in_stack_fffffffffffffdb0;
  LogicalType *in_stack_fffffffffffffdb8;
  Vector *in_stack_fffffffffffffdc0;
  UnifiedVectorFormat *in_stack_fffffffffffffe40;
  idx_t in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5e;
  allocator in_stack_fffffffffffffe5f;
  string local_1a0 [4];
  ScanVectorType in_stack_fffffffffffffe64;
  idx_t in_stack_fffffffffffffe68;
  Vector *in_stack_fffffffffffffe70;
  ColumnScanState *in_stack_fffffffffffffe78;
  ColumnData *in_stack_fffffffffffffe80;
  ulong local_168;
  uint64_t local_160;
  UnifiedVectorFormat local_138;
  idx_t local_f0;
  undefined1 local_65;
  allocator local_51;
  string local_50 [56];
  long local_18;
  idx_t local_8;
  
  if (in_R8 != 0) {
    local_65 = 1;
    uVar4 = __cxa_allocate_exception(0x10);
    paVar13 = &local_51;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_50,"ListColumnData::ScanCount not supported with result_offset > 0",paVar13);
    InternalException::InternalException
              ((InternalException *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_65 = 0;
    __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
  }
  if (in_RCX == 0) {
    local_8 = 0;
  }
  else {
    local_18 = in_RSI;
    LogicalType::LogicalType
              (in_stack_fffffffffffffda0,(LogicalTypeId)((ulong)in_stack_fffffffffffffd98 >> 0x38));
    Vector::Vector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    LogicalType::~LogicalType((LogicalType *)0xba01ae);
    local_f0 = ColumnData::ScanVector
                         (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                          in_stack_fffffffffffffe64,
                          CONCAT17(in_stack_fffffffffffffe5f,
                                   CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
    vector<duckdb::ColumnScanState,_true>::operator[]
              ((vector<duckdb::ColumnScanState,_true> *)in_stack_fffffffffffffd80,
               (size_type)in_stack_fffffffffffffd78);
    ColumnData::ScanCount
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (idx_t)in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd90);
    Vector::ToUnifiedFormat(in_RDI,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    puVar5 = UnifiedVectorFormat::GetData<unsigned_long>(&local_138);
    iVar6 = SelectionVector::get_index(local_138.sel,local_f0 - 1);
    uVar1 = puVar5[iVar6];
    plVar7 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xba0309);
    lVar8 = *(long *)(local_18 + 0x60);
    local_160 = 0;
    for (local_168 = 0; local_168 < local_f0; local_168 = local_168 + 1) {
      iVar6 = SelectionVector::get_index(local_138.sel,local_168);
      plVar7[local_168].offset = local_160;
      plVar7[local_168].length = (puVar5[iVar6] - local_160) - lVar8;
      local_160 = plVar7[local_168].length + local_160;
    }
    lVar8 = uVar1 - lVar8;
    ListVector::Reserve((Vector *)in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78);
    if (lVar8 != 0) {
      this_00 = ListVector::GetEntry((Vector *)0xba04df);
      pLVar9 = Vector::GetType(this_00);
      PVar2 = LogicalType::InternalType(pLVar9);
      if (PVar2 != STRUCT) {
        pLVar9 = Vector::GetType(this_00);
        PVar2 = LogicalType::InternalType(pLVar9);
        if (PVar2 != ARRAY) {
          pvVar10 = vector<duckdb::ColumnScanState,_true>::operator[]
                              ((vector<duckdb::ColumnScanState,_true> *)in_stack_fffffffffffffd80,
                               (size_type)in_stack_fffffffffffffd78);
          uVar11 = pvVar10->row_index + lVar8;
          pCVar12 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
                    operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                                *)in_stack_fffffffffffffd80);
          iVar6 = pCVar12->start;
          pCVar12 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
                    operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                                *)in_stack_fffffffffffffd80);
          iVar3 = (*pCVar12->_vptr_ColumnData[3])();
          if (iVar6 + CONCAT44(extraout_var,iVar3) < uVar11) {
            uVar4 = __cxa_allocate_exception(0x10);
            paVar13 = (allocator *)&stack0xfffffffffffffe5f;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1a0,
                       "ListColumnData::ScanCount - internal list scan offset is out of range",
                       paVar13);
            InternalException::InternalException
                      ((InternalException *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
            __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
          }
        }
      }
      pCVar12 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
                operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                            *)in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd80 =
           vector<duckdb::ColumnScanState,_true>::operator[]
                     ((vector<duckdb::ColumnScanState,_true> *)in_stack_fffffffffffffd80,
                      (size_type)in_stack_fffffffffffffd78);
      (*pCVar12->_vptr_ColumnData[0xc])(pCVar12,in_stack_fffffffffffffd80,this_00,lVar8,0);
    }
    *(unsigned_long *)(local_18 + 0x60) = uVar1;
    ListVector::SetListSize((Vector *)in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78);
    local_8 = local_f0;
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd80);
    Vector::~Vector((Vector *)in_stack_fffffffffffffd80);
  }
  return local_8;
}

Assistant:

idx_t ListColumnData::ScanCount(ColumnScanState &state, Vector &result, idx_t count, idx_t result_offset) {
	if (result_offset > 0) {
		throw InternalException("ListColumnData::ScanCount not supported with result_offset > 0");
	}
	if (count == 0) {
		return 0;
	}
	// updates not supported for lists
	D_ASSERT(!updates);

	Vector offset_vector(LogicalType::UBIGINT, count);
	idx_t scan_count = ScanVector(state, offset_vector, count, ScanVectorType::SCAN_FLAT_VECTOR);
	D_ASSERT(scan_count > 0);
	validity.ScanCount(state.child_states[0], result, count);

	UnifiedVectorFormat offsets;
	offset_vector.ToUnifiedFormat(scan_count, offsets);
	auto data = UnifiedVectorFormat::GetData<uint64_t>(offsets);
	auto last_entry = data[offsets.sel->get_index(scan_count - 1)];

	// shift all offsets so they are 0 at the first entry
	auto result_data = FlatVector::GetData<list_entry_t>(result);
	auto base_offset = state.last_offset;
	idx_t current_offset = 0;
	for (idx_t i = 0; i < scan_count; i++) {
		auto offset_index = offsets.sel->get_index(i);
		result_data[i].offset = current_offset;
		result_data[i].length = data[offset_index] - current_offset - base_offset;
		current_offset += result_data[i].length;
	}

	D_ASSERT(last_entry >= base_offset);
	idx_t child_scan_count = last_entry - base_offset;
	ListVector::Reserve(result, child_scan_count);

	if (child_scan_count > 0) {
		auto &child_entry = ListVector::GetEntry(result);
		if (child_entry.GetType().InternalType() != PhysicalType::STRUCT &&
		    child_entry.GetType().InternalType() != PhysicalType::ARRAY &&
		    state.child_states[1].row_index + child_scan_count > child_column->start + child_column->GetMaxEntry()) {
			throw InternalException("ListColumnData::ScanCount - internal list scan offset is out of range");
		}
		child_column->ScanCount(state.child_states[1], child_entry, child_scan_count);
	}
	state.last_offset = last_entry;

	ListVector::SetListSize(result, child_scan_count);
	return scan_count;
}